

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O2

int check(int classid,vector<paaword,_std::allocator<paaword>_> *tmp_result,int ENOUGH_COVER)

{
  int *piVar1;
  _Rb_tree_color tsid;
  pointer ppVar2;
  void *pvVar3;
  ulong uVar4;
  _Base_ptr p_Var5;
  size_type sVar6;
  ulong uVar7;
  int iVar8;
  double dVar9;
  int local_1f4;
  double local_1f0;
  int local_1e8;
  int local_1e4;
  vector<paaword,_std::allocator<paaword>_> *local_1e0;
  ulong local_1d8;
  double local_1d0;
  paaword paa;
  paaword local_140;
  paaword local_b8;
  
  iVar8 = data_n;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)data_n) {
    uVar4 = (long)data_n * 4;
  }
  local_1e8 = classid;
  local_1e4 = ENOUGH_COVER;
  local_1e0 = tmp_result;
  pvVar3 = operator_new__(uVar4);
  uVar4 = 0;
  uVar7 = 0;
  if (0 < iVar8) {
    uVar7 = (ulong)(uint)iVar8;
  }
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    *(undefined4 *)((long)pvVar3 + uVar4 * 4) = 0;
  }
  uVar4 = 0;
  while (ppVar2 = (local_1e0->super__Vector_base<paaword,_std::allocator<paaword>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar4 < (ulong)(((long)(local_1e0->super__Vector_base<paaword,_std::allocator<paaword>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) / 0x88)) {
    local_1d8 = uVar4;
    paaword::paaword(&paa,ppVar2 + uVar4);
    local_1f0 = -1.0;
    for (p_Var5 = paa.cov._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &paa.cov._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      tsid = p_Var5[1]._M_color;
      paaword::paaword(&local_b8,&paa);
      dVar9 = calculatedis(&local_b8,tsid);
      if (dVar9 <= local_1f0) {
        dVar9 = local_1f0;
      }
      local_1f0 = dVar9;
      paaword::~paaword(&local_b8);
      piVar1 = (int *)((long)pvVar3 + (long)(int)tsid * 4);
      *piVar1 = *piVar1 + 1;
    }
    local_1f0 = local_1f0 + 1e-08;
    for (local_1f4 = 0; local_1f4 < data_n; local_1f4 = local_1f4 + 1) {
      sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(&paa.cov,&local_1f4);
      if (sVar6 == 0) {
        paaword::paaword(&local_140,&paa);
        local_1d0 = calculatedis(&local_140,local_1f4);
        paaword::~paaword(&local_140);
        if (local_1d0 < local_1f0) {
          piVar1 = (int *)((long)pvVar3 + (long)local_1f4 * 4);
          *piVar1 = *piVar1 + 1;
        }
      }
    }
    paaword::~paaword(&paa);
    uVar4 = local_1d8 + 1;
  }
  uVar7 = 0;
  uVar4 = (ulong)(uint)data_n;
  if (data_n < 1) {
    uVar4 = uVar7;
  }
  iVar8 = 0;
  for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    if (local_1e4 <= *(int *)((long)pvVar3 + uVar7 * 4)) {
      iVar8 = iVar8 + (uint)(label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar7] != local_1e8);
    }
  }
  operator_delete__(pvVar3);
  return iVar8;
}

Assistant:

int check(int classid, vector<paaword> tmp_result, int ENOUGH_COVER) {
    int *cnt_cover = new int[data_n];
    for (int i = 0; i < data_n; ++i) {
        cnt_cover[i] = 0;
    }
//    for (paaword paa : tmp_result) {
    for (int i = 0; i < tmp_result.size(); ++i) {
        paaword paa = tmp_result[i];
        double max_dis = -1;
//        for (int cov : paa.cov) {
        for (set<int>::iterator cov_it = paa.cov.begin(); cov_it != paa.cov.end(); ++cov_it) {
            int cov = *cov_it;
            max_dis = max(max_dis, calculatedis(paa, cov));
            ++cnt_cover[cov];
        }
        max_dis += 1e-8;
        for (int i = 0; i < data_n; ++i) {
            if (!paa.cov.count(i)) {
                if (calculatedis(paa, i) < max_dis) {
                    ++cnt_cover[i];
                }
            }
        }
    }
//    printf("wrong cover ts:");
    int cnt_wrong = 0;
    for (int i = 0; i < data_n; ++i) {
        if (cnt_cover[i] >= ENOUGH_COVER && label[i] != classid) {
            ++cnt_wrong;
//            printf("%3d", i);
        }
    }
//    printf("\n");
    delete[] cnt_cover;
    return cnt_wrong;
}